

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

void __thiscall QGraphicsItem::setAcceptHoverEvents(QGraphicsItem *this,bool enabled)

{
  uint uVar1;
  QGraphicsItemPrivate *pQVar2;
  ulong uVar3;
  QGraphicsScene *pQVar4;
  long lVar5;
  
  pQVar2 = (this->d_ptr).d;
  uVar3 = *(ulong *)&pQVar2->field_0x160;
  if ((((uint)uVar3 >> 10 & 1) == 0) == enabled) {
    *(ulong *)&pQVar2->field_0x160 = uVar3 & 0xfffffffffffffbff | (ulong)enabled << 10;
    pQVar2 = (this->d_ptr).d;
    if (((pQVar2->field_0x161 & 4) != 0) &&
       (pQVar4 = pQVar2->scene, pQVar4 != (QGraphicsScene *)0x0)) {
      lVar5 = *(long *)&pQVar4->field_0x8;
      uVar1 = *(uint *)(lVar5 + 0xb8);
      if ((uVar1 >> 0xc & 1) != 0) {
        *(uint *)(lVar5 + 0xb8) = uVar1 & 0xffffefff;
        QGraphicsScenePrivate::enableMouseTrackingOnViews
                  (*(QGraphicsScenePrivate **)&((this->d_ptr).d)->scene->field_0x8);
        return;
      }
    }
  }
  return;
}

Assistant:

T *operator->() const noexcept
    {
        return d;
    }